

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_attach(AMQP_VALUE value,ATTACH_HANDLE *attach_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  ATTACH_HANDLE pAVar3;
  AMQP_VALUE pAVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  char *name;
  AMQP_VALUE offered_capabilities_array;
  
  pAVar3 = (ATTACH_HANDLE)malloc(8);
  if (pAVar3 == (ATTACH_HANDLE)0x0) {
    *attach_handle = (ATTACH_HANDLE)0x0;
    return 0xdef;
  }
  pAVar3->composite_value = (AMQP_VALUE)0x0;
  *attach_handle = pAVar3;
  pAVar4 = amqpvalue_get_inplace_described_value(value);
  if (pAVar4 == (AMQP_VALUE)0x0) {
    attach_destroy(*attach_handle);
    return 0xdf7;
  }
  iVar1 = amqpvalue_get_list_item_count(pAVar4,&list_item_count);
  if (iVar1 != 0) {
    return 0xdfe;
  }
  if (list_item_count == 0) {
    return 0xe2b;
  }
  pAVar5 = amqpvalue_get_list_item(pAVar4,0);
  if (pAVar5 == (AMQP_VALUE)0x0) {
    attach_destroy(*attach_handle);
    return 0xe0d;
  }
  AVar2 = amqpvalue_get_type(pAVar5);
  if (AVar2 == AMQP_TYPE_NULL) {
    amqpvalue_destroy(pAVar5);
    attach_destroy(*attach_handle);
    return 0xe17;
  }
  iVar1 = amqpvalue_get_string(pAVar5,&name);
  if (iVar1 != 0) {
    amqpvalue_destroy(pAVar5);
    attach_destroy(*attach_handle);
    return 0xe21;
  }
  amqpvalue_destroy(pAVar5);
  if (1 < list_item_count) {
    pAVar5 = amqpvalue_get_list_item(pAVar4,1);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      attach_destroy(*attach_handle);
      return 0xe36;
    }
    AVar2 = amqpvalue_get_type(pAVar5);
    if (AVar2 == AMQP_TYPE_NULL) {
      amqpvalue_destroy(pAVar5);
      attach_destroy(*attach_handle);
      return 0xe40;
    }
    iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&name);
    if (iVar1 != 0) {
      amqpvalue_destroy(pAVar5);
      attach_destroy(*attach_handle);
      return 0xe4a;
    }
    amqpvalue_destroy(pAVar5);
    if (2 < list_item_count) {
      pAVar5 = amqpvalue_get_list_item(pAVar4,2);
      if (pAVar5 == (AMQP_VALUE)0x0) {
        attach_destroy(*attach_handle);
        return 0xe5f;
      }
      AVar2 = amqpvalue_get_type(pAVar5);
      if (AVar2 != AMQP_TYPE_NULL) {
        iVar1 = amqpvalue_get_boolean(pAVar5,(_Bool *)&name);
        if (iVar1 != 0) {
          amqpvalue_destroy(pAVar5);
          attach_destroy(*attach_handle);
          return 0xe73;
        }
        amqpvalue_destroy(pAVar5);
        if (3 < list_item_count) {
          pAVar5 = amqpvalue_get_list_item(pAVar4,3);
          if (pAVar5 != (AMQP_VALUE)0x0) {
            AVar2 = amqpvalue_get_type(pAVar5);
            if ((AVar2 != AMQP_TYPE_NULL) &&
               (iVar1 = amqpvalue_get_ubyte(pAVar5,(uchar *)&name), iVar1 != 0)) {
              amqpvalue_destroy(pAVar5);
              attach_destroy(*attach_handle);
              return 0xe95;
            }
            amqpvalue_destroy(pAVar5);
          }
          if (4 < list_item_count) {
            pAVar5 = amqpvalue_get_list_item(pAVar4,4);
            if (pAVar5 != (AMQP_VALUE)0x0) {
              AVar2 = amqpvalue_get_type(pAVar5);
              if ((AVar2 != AMQP_TYPE_NULL) &&
                 (iVar1 = amqpvalue_get_ubyte(pAVar5,(uchar *)&name), iVar1 != 0)) {
                amqpvalue_destroy(pAVar5);
                attach_destroy(*attach_handle);
                return 0xeb2;
              }
              amqpvalue_destroy(pAVar5);
            }
            if (5 < list_item_count) {
              pAVar5 = amqpvalue_get_list_item(pAVar4,5);
              if (pAVar5 != (AMQP_VALUE)0x0) {
                amqpvalue_destroy(pAVar5);
              }
              if (6 < list_item_count) {
                pAVar5 = amqpvalue_get_list_item(pAVar4,6);
                if (pAVar5 != (AMQP_VALUE)0x0) {
                  amqpvalue_destroy(pAVar5);
                }
                if (7 < list_item_count) {
                  pAVar5 = amqpvalue_get_list_item(pAVar4,7);
                  if (pAVar5 != (AMQP_VALUE)0x0) {
                    AVar2 = amqpvalue_get_type(pAVar5);
                    if ((AVar2 != AMQP_TYPE_NULL) &&
                       (iVar1 = amqpvalue_get_map(pAVar5,(AMQP_VALUE *)&name), iVar1 != 0)) {
                      amqpvalue_destroy(pAVar5);
                      attach_destroy(*attach_handle);
                      return 0xee9;
                    }
                    amqpvalue_destroy(pAVar5);
                  }
                  if (8 < list_item_count) {
                    pAVar5 = amqpvalue_get_list_item(pAVar4,8);
                    if (pAVar5 != (AMQP_VALUE)0x0) {
                      AVar2 = amqpvalue_get_type(pAVar5);
                      if ((AVar2 != AMQP_TYPE_NULL) &&
                         (iVar1 = amqpvalue_get_boolean(pAVar5,(_Bool *)&name), iVar1 != 0)) {
                        amqpvalue_destroy(pAVar5);
                        attach_destroy(*attach_handle);
                        return 0xf06;
                      }
                      amqpvalue_destroy(pAVar5);
                    }
                    if (9 < list_item_count) {
                      pAVar5 = amqpvalue_get_list_item(pAVar4,9);
                      if (pAVar5 != (AMQP_VALUE)0x0) {
                        AVar2 = amqpvalue_get_type(pAVar5);
                        if ((AVar2 != AMQP_TYPE_NULL) &&
                           (iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&name), iVar1 != 0)) {
                          amqpvalue_destroy(pAVar5);
                          attach_destroy(*attach_handle);
                          return 0xf23;
                        }
                        amqpvalue_destroy(pAVar5);
                      }
                      if (10 < list_item_count) {
                        pAVar5 = amqpvalue_get_list_item(pAVar4,10);
                        if (pAVar5 != (AMQP_VALUE)0x0) {
                          AVar2 = amqpvalue_get_type(pAVar5);
                          if ((AVar2 != AMQP_TYPE_NULL) &&
                             (iVar1 = amqpvalue_get_ulong(pAVar5,(uint64_t *)&name), iVar1 != 0)) {
                            amqpvalue_destroy(pAVar5);
                            attach_destroy(*attach_handle);
                            return 0xf40;
                          }
                          amqpvalue_destroy(pAVar5);
                        }
                        if (0xb < list_item_count) {
                          pAVar5 = amqpvalue_get_list_item(pAVar4,0xb);
                          if (pAVar5 != (AMQP_VALUE)0x0) {
                            AVar2 = amqpvalue_get_type(pAVar5);
                            if (AVar2 != AMQP_TYPE_NULL) {
                              name = (char *)0x0;
                              AVar2 = amqpvalue_get_type(pAVar5);
                              if (((AVar2 != AMQP_TYPE_ARRAY) ||
                                  (iVar1 = amqpvalue_get_array(pAVar5,&offered_capabilities_array),
                                  iVar1 != 0)) &&
                                 (iVar1 = amqpvalue_get_symbol(pAVar5,&name), iVar1 != 0)) {
                                amqpvalue_destroy(pAVar5);
                                attach_destroy(*attach_handle);
                                return 0xf5f;
                              }
                            }
                            amqpvalue_destroy(pAVar5);
                          }
                          if (0xc < list_item_count) {
                            pAVar5 = amqpvalue_get_list_item(pAVar4,0xc);
                            if (pAVar5 != (AMQP_VALUE)0x0) {
                              AVar2 = amqpvalue_get_type(pAVar5);
                              if (AVar2 != AMQP_TYPE_NULL) {
                                name = (char *)0x0;
                                AVar2 = amqpvalue_get_type(pAVar5);
                                if (((AVar2 != AMQP_TYPE_ARRAY) ||
                                    (iVar1 = amqpvalue_get_array(pAVar5,&offered_capabilities_array)
                                    , iVar1 != 0)) &&
                                   (iVar1 = amqpvalue_get_symbol(pAVar5,&name), iVar1 != 0)) {
                                  amqpvalue_destroy(pAVar5);
                                  attach_destroy(*attach_handle);
                                  return 0xf7e;
                                }
                              }
                              amqpvalue_destroy(pAVar5);
                            }
                            if ((0xd < list_item_count) &&
                               (pAVar4 = amqpvalue_get_list_item(pAVar4,0xd),
                               pAVar4 != (AMQP_VALUE)0x0)) {
                              AVar2 = amqpvalue_get_type(pAVar4);
                              if ((AVar2 != AMQP_TYPE_NULL) &&
                                 (iVar1 = amqpvalue_get_map(pAVar4,(AMQP_VALUE *)&name), iVar1 != 0)
                                 ) {
                                amqpvalue_destroy(pAVar4);
                                attach_destroy(*attach_handle);
                                return 0xf9b;
                              }
                              amqpvalue_destroy(pAVar4);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pAVar4 = amqpvalue_clone(value);
        pAVar3->composite_value = pAVar4;
        return 0;
      }
      amqpvalue_destroy(pAVar5);
      attach_destroy(*attach_handle);
      return 0xe69;
    }
    return 0xe7d;
  }
  return 0xe54;
}

Assistant:

int amqpvalue_get_attach(AMQP_VALUE value, ATTACH_HANDLE* attach_handle)
{
    int result;
    ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach_create_internal();
    *attach_handle = attach_instance;
    if (*attach_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            attach_destroy(*attach_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* name */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* name;
                                if (amqpvalue_get_string(item_value, &name) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* handle */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* role */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                role role;
                                if (amqpvalue_get_role(item_value, &role) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* snd-settle-mode */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sender_settle_mode snd_settle_mode;
                                if (amqpvalue_get_sender_settle_mode(item_value, &snd_settle_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* rcv-settle-mode */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                receiver_settle_mode rcv_settle_mode;
                                if (amqpvalue_get_receiver_settle_mode(item_value, &rcv_settle_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* source */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* target */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* unsettled */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                AMQP_VALUE unsettled;
                                if (amqpvalue_get_map(item_value, &unsettled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* incomplete-unsettled */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool incomplete_unsettled;
                                if (amqpvalue_get_boolean(item_value, &incomplete_unsettled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* initial-delivery-count */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sequence_no initial_delivery_count;
                                if (amqpvalue_get_sequence_no(item_value, &initial_delivery_count) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* max-message-size */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint64_t max_message_size;
                                if (amqpvalue_get_ulong(item_value, &max_message_size) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 11)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 11);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 12)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 12);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 13)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 13);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    attach_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}